

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  RTCIntersectArguments *pRVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  bool bVar23;
  undefined1 auVar24 [16];
  AABBNodeMB4D *node1;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong unaff_RBX;
  size_t mask;
  int iVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  float fVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  undefined1 auVar49 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar60 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar61 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar90;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar91;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar95 [16];
  float fVar92;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar99;
  float fVar100;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [32];
  float fVar102;
  float fVar103;
  float fVar109;
  float fVar111;
  undefined1 auVar104 [16];
  float fVar113;
  undefined1 auVar105 [16];
  float fVar110;
  float fVar112;
  float fVar114;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar132;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar130;
  float fVar131;
  undefined1 auVar129 [32];
  float fVar133;
  float fVar134;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar143;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar150 [16];
  float fVar155;
  undefined1 auVar156 [16];
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar159 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar167 [16];
  float fVar170;
  UVIdentity<4> mapUV;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  float local_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  Scene *scene;
  int local_157c;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  undefined1 local_1568 [16];
  ulong local_1550;
  ulong local_1548;
  ulong local_1540;
  ulong local_1538;
  ulong local_1530;
  ulong local_1528;
  NodeRef *local_1520;
  undefined1 local_1518 [8];
  float fStack_1510;
  float fStack_150c;
  undefined1 local_1508 [8];
  float fStack_1500;
  float fStack_14fc;
  ulong local_14f8;
  ulong local_14f0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  UVIdentity<4> *local_1398;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  NodeRef stack [564];
  
  auVar24 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar92 = ray->tfar, 0.0 <= fVar92)) {
    local_1520 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    auVar119 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    aVar5 = (ray->dir).field_0;
    auVar44._8_4_ = 0x7fffffff;
    auVar44._0_8_ = 0x7fffffff7fffffff;
    auVar44._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx((undefined1  [16])aVar5,auVar44);
    auVar93._8_4_ = 0x219392ef;
    auVar93._0_8_ = 0x219392ef219392ef;
    auVar93._12_4_ = 0x219392ef;
    auVar44 = vcmpps_avx(auVar44,auVar93,1);
    auVar120._8_4_ = 0x3f800000;
    auVar120._0_8_ = &DAT_3f8000003f800000;
    auVar120._12_4_ = 0x3f800000;
    auVar93 = vdivps_avx(auVar120,(undefined1  [16])aVar5);
    auVar94._8_4_ = 0x5d5e0b6b;
    auVar94._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar94._12_4_ = 0x5d5e0b6b;
    auVar44 = vblendvps_avx(auVar93,auVar94,auVar44);
    auVar77._0_4_ = auVar44._0_4_ * 0.99999964;
    auVar77._4_4_ = auVar44._4_4_ * 0.99999964;
    auVar77._8_4_ = auVar44._8_4_ * 0.99999964;
    auVar77._12_4_ = auVar44._12_4_ * 0.99999964;
    auVar62._0_4_ = auVar44._0_4_ * 1.0000004;
    auVar62._4_4_ = auVar44._4_4_ * 1.0000004;
    auVar62._8_4_ = auVar44._8_4_ * 1.0000004;
    auVar62._12_4_ = auVar44._12_4_ * 1.0000004;
    uVar4 = *(undefined4 *)&(ray->org).field_0;
    auVar129._4_4_ = uVar4;
    auVar129._0_4_ = uVar4;
    auVar129._8_4_ = uVar4;
    auVar129._12_4_ = uVar4;
    auVar129._16_4_ = uVar4;
    auVar129._20_4_ = uVar4;
    auVar129._24_4_ = uVar4;
    auVar129._28_4_ = uVar4;
    local_11f8 = *(float *)((long)&(ray->org).field_0 + 4);
    fStack_11f4 = local_11f8;
    fStack_11f0 = local_11f8;
    fStack_11ec = local_11f8;
    fStack_11e8 = local_11f8;
    fStack_11e4 = local_11f8;
    fStack_11e0 = local_11f8;
    fStack_11dc = local_11f8;
    local_1218 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    uStack_1214 = local_1218;
    uStack_1210 = local_1218;
    uStack_120c = local_1218;
    uStack_1208 = local_1218;
    uStack_1204 = local_1218;
    uStack_1200 = local_1218;
    uStack_11fc = local_1218;
    auVar44 = vshufps_avx(auVar77,auVar77,0);
    register0x00001310 = auVar44;
    _local_1238 = auVar44;
    auVar44 = vmovshdup_avx(auVar77);
    auVar93 = vshufps_avx(auVar77,auVar77,0x55);
    register0x00001350 = auVar93;
    _local_1258 = auVar93;
    auVar93 = vshufpd_avx(auVar77,auVar77,1);
    auVar120 = vshufps_avx(auVar77,auVar77,0xaa);
    register0x000012d0 = auVar120;
    _local_1278 = auVar120;
    auVar120 = vshufps_avx(auVar62,auVar62,0);
    register0x000012d0 = auVar120;
    _local_1298 = auVar120;
    auVar120 = vshufps_avx(auVar62,auVar62,0x55);
    register0x000012d0 = auVar120;
    _local_12b8 = auVar120;
    auVar120 = vshufps_avx(auVar62,auVar62,0xaa);
    register0x00001290 = auVar120;
    _local_12d8 = auVar120;
    auVar73 = ZEXT3264(_local_12d8);
    uVar36 = (ulong)(auVar77._0_4_ < 0.0) << 5;
    uVar32 = (ulong)(auVar44._0_4_ < 0.0) << 5 | 0x40;
    uVar33 = (ulong)(auVar93._0_4_ < 0.0) << 5 | 0x80;
    uVar39 = uVar36 ^ 0x20;
    uVar41 = uVar32 ^ 0x20;
    uVar38 = uVar33 ^ 0x20;
    auVar44 = vshufps_avx(auVar119,auVar119,0);
    local_12f8._16_16_ = auVar44;
    local_12f8._0_16_ = auVar44;
    auVar61 = ZEXT3264(local_12f8);
    auVar44 = vshufps_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),0);
    local_1318._16_16_ = auVar44;
    local_1318._0_16_ = auVar44;
    local_1550 = uVar38;
    local_1548 = uVar41;
    local_1540 = uVar39;
    local_1538 = uVar33;
    local_1530 = uVar32;
    local_1528 = uVar36;
    do {
      if (local_1520 == stack) {
        return;
      }
      sVar35 = local_1520[-1].ptr;
      local_1520 = local_1520 + -1;
      do {
        if ((sVar35 & 8) == 0) {
          uVar25 = sVar35 & 0xfffffffffffffff0;
          fVar92 = (ray->dir).field_0.m128[3];
          auVar49._4_4_ = fVar92;
          auVar49._0_4_ = fVar92;
          auVar49._8_4_ = fVar92;
          auVar49._12_4_ = fVar92;
          auVar49._16_4_ = fVar92;
          auVar49._20_4_ = fVar92;
          auVar49._24_4_ = fVar92;
          auVar49._28_4_ = fVar92;
          pfVar3 = (float *)(uVar25 + 0x100 + uVar36);
          pfVar1 = (float *)(uVar25 + 0x40 + uVar36);
          auVar60._0_4_ = fVar92 * *pfVar3 + *pfVar1;
          auVar60._4_4_ = fVar92 * pfVar3[1] + pfVar1[1];
          auVar60._8_4_ = fVar92 * pfVar3[2] + pfVar1[2];
          auVar60._12_4_ = fVar92 * pfVar3[3] + pfVar1[3];
          auVar60._16_4_ = fVar92 * pfVar3[4] + pfVar1[4];
          auVar60._20_4_ = fVar92 * pfVar3[5] + pfVar1[5];
          auVar60._24_4_ = fVar92 * pfVar3[6] + pfVar1[6];
          auVar60._28_4_ = auVar61._28_4_ + pfVar1[7];
          auVar60 = vsubps_avx(auVar60,auVar129);
          auVar15._4_4_ = auVar60._4_4_ * (float)local_1238._4_4_;
          auVar15._0_4_ = auVar60._0_4_ * (float)local_1238._0_4_;
          auVar15._8_4_ = auVar60._8_4_ * fStack_1230;
          auVar15._12_4_ = auVar60._12_4_ * fStack_122c;
          auVar15._16_4_ = auVar60._16_4_ * fStack_1228;
          auVar15._20_4_ = auVar60._20_4_ * fStack_1224;
          auVar15._24_4_ = auVar60._24_4_ * fStack_1220;
          auVar15._28_4_ = auVar60._28_4_;
          pfVar3 = (float *)(uVar25 + 0x100 + uVar32);
          pfVar1 = (float *)(uVar25 + 0x40 + uVar32);
          auVar71._0_4_ = fVar92 * *pfVar3 + *pfVar1;
          auVar71._4_4_ = fVar92 * pfVar3[1] + pfVar1[1];
          auVar71._8_4_ = fVar92 * pfVar3[2] + pfVar1[2];
          auVar71._12_4_ = fVar92 * pfVar3[3] + pfVar1[3];
          auVar71._16_4_ = fVar92 * pfVar3[4] + pfVar1[4];
          auVar71._20_4_ = fVar92 * pfVar3[5] + pfVar1[5];
          auVar71._24_4_ = fVar92 * pfVar3[6] + pfVar1[6];
          auVar71._28_4_ = auVar73._28_4_ + pfVar1[7];
          auVar60 = vmaxps_avx(local_12f8,auVar15);
          auVar22._4_4_ = fStack_11f4;
          auVar22._0_4_ = local_11f8;
          auVar22._8_4_ = fStack_11f0;
          auVar22._12_4_ = fStack_11ec;
          auVar22._16_4_ = fStack_11e8;
          auVar22._20_4_ = fStack_11e4;
          auVar22._24_4_ = fStack_11e0;
          auVar22._28_4_ = fStack_11dc;
          auVar15 = vsubps_avx(auVar71,auVar22);
          pfVar3 = (float *)(uVar25 + 0x100 + uVar33);
          auVar17._4_4_ = auVar15._4_4_ * (float)local_1258._4_4_;
          auVar17._0_4_ = auVar15._0_4_ * (float)local_1258._0_4_;
          auVar17._8_4_ = auVar15._8_4_ * fStack_1250;
          auVar17._12_4_ = auVar15._12_4_ * fStack_124c;
          auVar17._16_4_ = auVar15._16_4_ * fStack_1248;
          auVar17._20_4_ = auVar15._20_4_ * fStack_1244;
          auVar17._24_4_ = auVar15._24_4_ * fStack_1240;
          auVar17._28_4_ = auVar15._28_4_;
          pfVar1 = (float *)(uVar25 + 0x40 + uVar33);
          auVar84._0_4_ = fVar92 * *pfVar3 + *pfVar1;
          auVar84._4_4_ = fVar92 * pfVar3[1] + pfVar1[1];
          auVar84._8_4_ = fVar92 * pfVar3[2] + pfVar1[2];
          auVar84._12_4_ = fVar92 * pfVar3[3] + pfVar1[3];
          auVar84._16_4_ = fVar92 * pfVar3[4] + pfVar1[4];
          auVar84._20_4_ = fVar92 * pfVar3[5] + pfVar1[5];
          auVar84._24_4_ = fVar92 * pfVar3[6] + pfVar1[6];
          auVar84._28_4_ = local_12f8._28_4_ + pfVar1[7];
          auVar21._4_4_ = uStack_1214;
          auVar21._0_4_ = local_1218;
          auVar21._8_4_ = uStack_1210;
          auVar21._12_4_ = uStack_120c;
          auVar21._16_4_ = uStack_1208;
          auVar21._20_4_ = uStack_1204;
          auVar21._24_4_ = uStack_1200;
          auVar21._28_4_ = uStack_11fc;
          auVar16 = vsubps_avx(auVar84,auVar21);
          auVar18._4_4_ = auVar16._4_4_ * (float)local_1278._4_4_;
          auVar18._0_4_ = auVar16._0_4_ * (float)local_1278._0_4_;
          auVar18._8_4_ = auVar16._8_4_ * fStack_1270;
          auVar18._12_4_ = auVar16._12_4_ * fStack_126c;
          auVar18._16_4_ = auVar16._16_4_ * fStack_1268;
          auVar18._20_4_ = auVar16._20_4_ * fStack_1264;
          auVar18._24_4_ = auVar16._24_4_ * fStack_1260;
          auVar18._28_4_ = auVar16._28_4_;
          auVar15 = vmaxps_avx(auVar17,auVar18);
          pfVar3 = (float *)(uVar25 + 0x100 + uVar39);
          auVar60 = vmaxps_avx(auVar60,auVar15);
          pfVar1 = (float *)(uVar25 + 0x40 + uVar39);
          auVar72._0_4_ = fVar92 * *pfVar3 + *pfVar1;
          auVar72._4_4_ = fVar92 * pfVar3[1] + pfVar1[1];
          auVar72._8_4_ = fVar92 * pfVar3[2] + pfVar1[2];
          auVar72._12_4_ = fVar92 * pfVar3[3] + pfVar1[3];
          auVar72._16_4_ = fVar92 * pfVar3[4] + pfVar1[4];
          auVar72._20_4_ = fVar92 * pfVar3[5] + pfVar1[5];
          auVar72._24_4_ = fVar92 * pfVar3[6] + pfVar1[6];
          auVar72._28_4_ = auVar16._28_4_ + pfVar1[7];
          auVar15 = vsubps_avx(auVar72,auVar129);
          auVar16._4_4_ = auVar15._4_4_ * (float)local_1298._4_4_;
          auVar16._0_4_ = auVar15._0_4_ * (float)local_1298._0_4_;
          auVar16._8_4_ = auVar15._8_4_ * fStack_1290;
          auVar16._12_4_ = auVar15._12_4_ * fStack_128c;
          auVar16._16_4_ = auVar15._16_4_ * fStack_1288;
          auVar16._20_4_ = auVar15._20_4_ * fStack_1284;
          auVar16._24_4_ = auVar15._24_4_ * fStack_1280;
          auVar16._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(local_1318,auVar16);
          pfVar3 = (float *)(uVar25 + 0x100 + uVar41);
          pfVar1 = (float *)(uVar25 + 0x40 + uVar41);
          auVar85._0_4_ = fVar92 * *pfVar3 + *pfVar1;
          auVar85._4_4_ = fVar92 * pfVar3[1] + pfVar1[1];
          auVar85._8_4_ = fVar92 * pfVar3[2] + pfVar1[2];
          auVar85._12_4_ = fVar92 * pfVar3[3] + pfVar1[3];
          auVar85._16_4_ = fVar92 * pfVar3[4] + pfVar1[4];
          auVar85._20_4_ = fVar92 * pfVar3[5] + pfVar1[5];
          auVar85._24_4_ = fVar92 * pfVar3[6] + pfVar1[6];
          auVar85._28_4_ = local_1318._28_4_ + pfVar1[7];
          auVar16 = vsubps_avx(auVar85,auVar22);
          auVar19._4_4_ = auVar16._4_4_ * (float)local_12b8._4_4_;
          auVar19._0_4_ = auVar16._0_4_ * (float)local_12b8._0_4_;
          auVar19._8_4_ = auVar16._8_4_ * fStack_12b0;
          auVar19._12_4_ = auVar16._12_4_ * fStack_12ac;
          auVar19._16_4_ = auVar16._16_4_ * fStack_12a8;
          auVar19._20_4_ = auVar16._20_4_ * fStack_12a4;
          auVar19._24_4_ = auVar16._24_4_ * fStack_12a0;
          auVar19._28_4_ = auVar16._28_4_;
          pfVar3 = (float *)(uVar25 + 0x100 + uVar38);
          pfVar1 = (float *)(uVar25 + 0x40 + uVar38);
          auVar98._0_4_ = fVar92 * *pfVar3 + *pfVar1;
          auVar98._4_4_ = fVar92 * pfVar3[1] + pfVar1[1];
          auVar98._8_4_ = fVar92 * pfVar3[2] + pfVar1[2];
          auVar98._12_4_ = fVar92 * pfVar3[3] + pfVar1[3];
          auVar98._16_4_ = fVar92 * pfVar3[4] + pfVar1[4];
          auVar98._20_4_ = fVar92 * pfVar3[5] + pfVar1[5];
          auVar98._24_4_ = fVar92 * pfVar3[6] + pfVar1[6];
          auVar98._28_4_ = fStack_11dc + pfVar1[7];
          auVar16 = vsubps_avx(auVar98,auVar21);
          auVar20._4_4_ = auVar16._4_4_ * (float)local_12d8._4_4_;
          auVar20._0_4_ = auVar16._0_4_ * (float)local_12d8._0_4_;
          auVar20._8_4_ = auVar16._8_4_ * fStack_12d0;
          auVar20._12_4_ = auVar16._12_4_ * fStack_12cc;
          auVar20._16_4_ = auVar16._16_4_ * fStack_12c8;
          auVar20._20_4_ = auVar16._20_4_ * fStack_12c4;
          auVar20._24_4_ = auVar16._24_4_ * fStack_12c0;
          auVar20._28_4_ = auVar16._28_4_;
          auVar16 = vminps_avx(auVar19,auVar20);
          auVar15 = vminps_avx(auVar15,auVar16);
          auVar60 = vcmpps_avx(auVar60,auVar15,2);
          auVar61 = ZEXT3264(auVar60);
          if (((uint)sVar35 & 7) == 6) {
            auVar15 = vcmpps_avx(*(undefined1 (*) [32])(uVar25 + 0x1c0),auVar49,2);
            auVar16 = vcmpps_avx(auVar49,*(undefined1 (*) [32])(uVar25 + 0x1e0),1);
            auVar16 = vandps_avx(auVar15,auVar16);
            auVar60 = vandps_avx(auVar16,auVar60);
            auVar61 = ZEXT1664(auVar60._16_16_);
            auVar44 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
          }
          else {
            auVar44 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
          }
          auVar73 = ZEXT3264(auVar15);
          auVar44 = vpsllw_avx(auVar44,0xf);
          auVar44 = vpacksswb_avx(auVar44,auVar44);
          unaff_RBX = (ulong)(byte)(SUB161(auVar44 >> 7,0) & 1 | (SUB161(auVar44 >> 0xf,0) & 1) << 1
                                    | (SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar44 >> 0x3f,0) << 7);
        }
        if ((sVar35 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar29 = 4;
          }
          else {
            uVar25 = sVar35 & 0xfffffffffffffff0;
            lVar27 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            iVar29 = 0;
            sVar35 = *(size_t *)(uVar25 + lVar27 * 8);
            uVar30 = unaff_RBX - 1 & unaff_RBX;
            if (uVar30 != 0) {
              local_1520->ptr = sVar35;
              lVar27 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              uVar26 = uVar30 - 1;
              while( true ) {
                local_1520 = local_1520 + 1;
                sVar35 = *(size_t *)(uVar25 + lVar27 * 8);
                uVar26 = uVar26 & uVar30;
                if (uVar26 == 0) break;
                local_1520->ptr = sVar35;
                lVar27 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                uVar30 = uVar26 - 1;
              }
            }
          }
        }
        else {
          iVar29 = 6;
        }
      } while (iVar29 == 0);
      if (iVar29 == 6) {
        iVar29 = 0;
        local_14f8 = (ulong)((uint)sVar35 & 0xf) - 8;
        bVar43 = local_14f8 != 0;
        if (bVar43) {
          uVar36 = sVar35 & 0xfffffffffffffff0;
          pSVar6 = context->scene;
          local_14f0 = 0;
          do {
            lVar31 = local_14f0 * 0x50;
            pGVar7 = (pSVar6->geometries).items[*(uint *)(uVar36 + 0x30 + lVar31)].ptr;
            fVar92 = (pGVar7->time_range).lower;
            fVar92 = pGVar7->fnumTimeSegments *
                     (((ray->dir).field_0.m128[3] - fVar92) / ((pGVar7->time_range).upper - fVar92))
            ;
            auVar44 = vroundss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),9);
            auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
            auVar65 = vmaxss_avx(ZEXT816(0),auVar44);
            lVar28 = (long)(int)auVar65._0_4_ * 0x38;
            uVar42 = (ulong)*(uint *)(uVar36 + 4 + lVar31);
            lVar27 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar28);
            lVar28 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar28);
            auVar44 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar36 + lVar31) * 4);
            uVar39 = (ulong)*(uint *)(uVar36 + 0x10 + lVar31);
            auVar93 = *(undefined1 (*) [16])(lVar27 + uVar39 * 4);
            uVar32 = (ulong)*(uint *)(uVar36 + 0x20 + lVar31);
            auVar80 = *(undefined1 (*) [16])(lVar27 + uVar32 * 4);
            auVar119 = *(undefined1 (*) [16])(lVar27 + uVar42 * 4);
            uVar33 = (ulong)*(uint *)(uVar36 + 0x14 + lVar31);
            auVar120 = *(undefined1 (*) [16])(lVar27 + uVar33 * 4);
            uVar41 = (ulong)*(uint *)(uVar36 + 0x24 + lVar31);
            auVar96 = *(undefined1 (*) [16])(lVar27 + uVar41 * 4);
            uVar40 = (ulong)*(uint *)(uVar36 + 8 + lVar31);
            auVar62 = *(undefined1 (*) [16])(lVar27 + uVar40 * 4);
            uVar26 = (ulong)*(uint *)(uVar36 + 0x18 + lVar31);
            auVar77 = *(undefined1 (*) [16])(lVar27 + uVar26 * 4);
            uVar25 = (ulong)*(uint *)(uVar36 + 0x28 + lVar31);
            auVar94 = *(undefined1 (*) [16])(lVar27 + uVar25 * 4);
            uVar38 = (ulong)*(uint *)(uVar36 + 0xc + lVar31);
            auVar45 = *(undefined1 (*) [16])(lVar27 + uVar38 * 4);
            uVar34 = (ulong)*(uint *)(uVar36 + 0x1c + lVar31);
            auVar53 = *(undefined1 (*) [16])(lVar27 + uVar34 * 4);
            uVar30 = (ulong)*(uint *)(uVar36 + 0x2c + lVar31);
            auVar54 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar28 + (ulong)*(uint *)(uVar36 + lVar31) * 4);
            auVar64 = *(undefined1 (*) [16])(lVar28 + uVar39 * 4);
            fVar92 = fVar92 - auVar65._0_4_;
            auVar65 = vunpcklps_avx(auVar44,auVar62);
            auVar62 = vunpckhps_avx(auVar44,auVar62);
            auVar66 = vunpcklps_avx(auVar119,auVar45);
            auVar119 = vunpckhps_avx(auVar119,auVar45);
            auVar44 = *(undefined1 (*) [16])(lVar28 + uVar42 * 4);
            auVar78 = vunpcklps_avx(auVar62,auVar119);
            auVar79 = vunpcklps_avx(auVar65,auVar66);
            auVar62 = vunpckhps_avx(auVar65,auVar66);
            auVar45 = vunpcklps_avx(auVar93,auVar77);
            auVar119 = vunpckhps_avx(auVar93,auVar77);
            auVar77 = vunpcklps_avx(auVar120,auVar53);
            auVar120 = vunpckhps_avx(auVar120,auVar53);
            auVar93 = *(undefined1 (*) [16])(lVar28 + uVar40 * 4);
            auVar53 = vunpcklps_avx(auVar119,auVar120);
            auVar65 = vunpcklps_avx(auVar45,auVar77);
            auVar120 = vunpckhps_avx(auVar45,auVar77);
            auVar45 = vunpcklps_avx(auVar80,auVar94);
            auVar77 = vunpckhps_avx(auVar80,auVar94);
            auVar66 = vunpcklps_avx(auVar96,auVar54);
            auVar94 = vunpckhps_avx(auVar96,auVar54);
            auVar119 = *(undefined1 (*) [16])(lVar28 + uVar38 * 4);
            auVar54 = vunpcklps_avx(auVar77,auVar94);
            auVar80 = vunpcklps_avx(auVar45,auVar66);
            auVar77 = vunpckhps_avx(auVar45,auVar66);
            auVar94 = vunpcklps_avx(auVar63,auVar93);
            auVar93 = vunpckhps_avx(auVar63,auVar93);
            auVar45 = vunpcklps_avx(auVar44,auVar119);
            auVar119 = vunpckhps_avx(auVar44,auVar119);
            auVar44 = *(undefined1 (*) [16])(lVar28 + uVar26 * 4);
            auVar63 = vunpcklps_avx(auVar93,auVar119);
            auVar66 = vunpcklps_avx(auVar94,auVar45);
            auVar119 = vunpckhps_avx(auVar94,auVar45);
            auVar45 = vunpcklps_avx(auVar64,auVar44);
            auVar94 = vunpckhps_avx(auVar64,auVar44);
            auVar44 = *(undefined1 (*) [16])(lVar28 + uVar33 * 4);
            auVar93 = *(undefined1 (*) [16])(lVar28 + uVar34 * 4);
            auVar64 = vunpcklps_avx(auVar44,auVar93);
            auVar44 = vunpckhps_avx(auVar44,auVar93);
            auVar96 = vunpcklps_avx(auVar94,auVar44);
            auVar97 = vunpcklps_avx(auVar45,auVar64);
            auVar94 = vunpckhps_avx(auVar45,auVar64);
            auVar44 = *(undefined1 (*) [16])(lVar28 + uVar32 * 4);
            auVar93 = *(undefined1 (*) [16])(lVar28 + uVar25 * 4);
            auVar64 = vunpcklps_avx(auVar44,auVar93);
            auVar45 = vunpckhps_avx(auVar44,auVar93);
            auVar44 = *(undefined1 (*) [16])(lVar28 + uVar41 * 4);
            auVar93 = *(undefined1 (*) [16])(lVar28 + uVar30 * 4);
            auVar95 = vunpcklps_avx(auVar44,auVar93);
            auVar44 = vunpckhps_avx(auVar44,auVar93);
            auVar105 = vunpcklps_avx(auVar45,auVar44);
            auVar106 = vunpcklps_avx(auVar64,auVar95);
            auVar45 = vunpckhps_avx(auVar64,auVar95);
            auVar44 = vshufps_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),0);
            auVar93 = vshufps_avx(ZEXT416((uint)(1.0 - fVar92)),ZEXT416((uint)(1.0 - fVar92)),0);
            fVar76 = auVar44._0_4_;
            fVar87 = auVar44._4_4_;
            fVar89 = auVar44._8_4_;
            fVar91 = auVar44._12_4_;
            fVar92 = auVar93._0_4_;
            fVar99 = auVar93._4_4_;
            fVar152 = auVar93._8_4_;
            fVar154 = auVar93._12_4_;
            auVar115._0_4_ = fVar92 * auVar79._0_4_ + fVar76 * auVar66._0_4_;
            auVar115._4_4_ = fVar99 * auVar79._4_4_ + fVar87 * auVar66._4_4_;
            auVar115._8_4_ = fVar152 * auVar79._8_4_ + fVar89 * auVar66._8_4_;
            auVar115._12_4_ = fVar154 * auVar79._12_4_ + fVar91 * auVar66._12_4_;
            auVar121._0_4_ = fVar92 * auVar62._0_4_ + fVar76 * auVar119._0_4_;
            auVar121._4_4_ = fVar99 * auVar62._4_4_ + fVar87 * auVar119._4_4_;
            auVar121._8_4_ = fVar152 * auVar62._8_4_ + fVar89 * auVar119._8_4_;
            auVar121._12_4_ = fVar154 * auVar62._12_4_ + fVar91 * auVar119._12_4_;
            local_1518._0_4_ = auVar78._0_4_;
            local_1518._4_4_ = auVar78._4_4_;
            fStack_1510 = auVar78._8_4_;
            fStack_150c = auVar78._12_4_;
            auVar95._0_4_ = fVar92 * (float)local_1518._0_4_ + fVar76 * auVar63._0_4_;
            auVar95._4_4_ = fVar99 * (float)local_1518._4_4_ + fVar87 * auVar63._4_4_;
            auVar95._8_4_ = fVar152 * fStack_1510 + fVar89 * auVar63._8_4_;
            auVar95._12_4_ = fVar154 * fStack_150c + fVar91 * auVar63._12_4_;
            auVar135._0_4_ = fVar92 * auVar65._0_4_ + fVar76 * auVar97._0_4_;
            auVar135._4_4_ = fVar99 * auVar65._4_4_ + fVar87 * auVar97._4_4_;
            auVar135._8_4_ = fVar152 * auVar65._8_4_ + fVar89 * auVar97._8_4_;
            auVar135._12_4_ = fVar154 * auVar65._12_4_ + fVar91 * auVar97._12_4_;
            auVar104._0_4_ = fVar92 * auVar120._0_4_ + fVar76 * auVar94._0_4_;
            auVar104._4_4_ = fVar99 * auVar120._4_4_ + fVar87 * auVar94._4_4_;
            auVar104._8_4_ = fVar152 * auVar120._8_4_ + fVar89 * auVar94._8_4_;
            auVar104._12_4_ = fVar154 * auVar120._12_4_ + fVar91 * auVar94._12_4_;
            puVar2 = (undefined8 *)(uVar36 + 0x30 + lVar31);
            local_13d8 = *puVar2;
            uStack_13d0 = puVar2[1];
            puVar2 = (undefined8 *)(uVar36 + 0x40 + lVar31);
            local_1578 = auVar53._0_4_;
            fStack_1574 = auVar53._4_4_;
            fStack_1570 = auVar53._8_4_;
            fStack_156c = auVar53._12_4_;
            auVar53._0_4_ = fVar92 * local_1578 + fVar76 * auVar96._0_4_;
            auVar53._4_4_ = fVar99 * fStack_1574 + fVar87 * auVar96._4_4_;
            auVar53._8_4_ = fVar152 * fStack_1570 + fVar89 * auVar96._8_4_;
            auVar53._12_4_ = fVar154 * fStack_156c + fVar91 * auVar96._12_4_;
            local_1508._0_4_ = auVar80._0_4_;
            local_1508._4_4_ = auVar80._4_4_;
            fStack_1500 = auVar80._8_4_;
            fStack_14fc = auVar80._12_4_;
            auVar63._0_4_ = fVar92 * (float)local_1508._0_4_ + fVar76 * auVar106._0_4_;
            auVar63._4_4_ = fVar99 * (float)local_1508._4_4_ + fVar87 * auVar106._4_4_;
            auVar63._8_4_ = fVar152 * fStack_1500 + fVar89 * auVar106._8_4_;
            auVar63._12_4_ = fVar154 * fStack_14fc + fVar91 * auVar106._12_4_;
            local_15c8 = auVar77._0_4_;
            fStack_15c4 = auVar77._4_4_;
            fStack_15c0 = auVar77._8_4_;
            fStack_15bc = auVar77._12_4_;
            auVar167._0_4_ = fVar92 * local_15c8 + fVar76 * auVar45._0_4_;
            auVar167._4_4_ = fVar99 * fStack_15c4 + fVar87 * auVar45._4_4_;
            auVar167._8_4_ = fVar152 * fStack_15c0 + fVar89 * auVar45._8_4_;
            auVar167._12_4_ = fVar154 * fStack_15bc + fVar91 * auVar45._12_4_;
            local_15b8 = auVar54._0_4_;
            fStack_15b4 = auVar54._4_4_;
            fStack_15b0 = auVar54._8_4_;
            fStack_15ac = auVar54._12_4_;
            auVar145._0_4_ = fVar76 * auVar105._0_4_ + fVar92 * local_15b8;
            auVar145._4_4_ = fVar87 * auVar105._4_4_ + fVar99 * fStack_15b4;
            auVar145._8_4_ = fVar89 * auVar105._8_4_ + fVar152 * fStack_15b0;
            auVar145._12_4_ = fVar91 * auVar105._12_4_ + fVar154 * fStack_15ac;
            local_13e8 = *puVar2;
            uStack_13e0 = puVar2[1];
            uVar4 = *(undefined4 *)&(ray->org).field_0;
            auVar150._4_4_ = uVar4;
            auVar150._0_4_ = uVar4;
            auVar150._8_4_ = uVar4;
            auVar150._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar156._4_4_ = uVar4;
            auVar156._0_4_ = uVar4;
            auVar156._8_4_ = uVar4;
            auVar156._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar159._4_4_ = uVar4;
            auVar159._0_4_ = uVar4;
            auVar159._8_4_ = uVar4;
            auVar159._12_4_ = uVar4;
            _local_1508 = vsubps_avx(auVar115,auVar150);
            _local_1518 = vsubps_avx(auVar121,auVar156);
            auVar44 = vsubps_avx(auVar95,auVar159);
            auVar93 = vsubps_avx(auVar135,auVar150);
            auVar119 = vsubps_avx(auVar104,auVar156);
            auVar120 = vsubps_avx(auVar53,auVar159);
            auVar62 = vsubps_avx(auVar63,auVar150);
            auVar77 = vsubps_avx(auVar167,auVar156);
            auVar94 = vsubps_avx(auVar145,auVar159);
            auVar45 = vsubps_avx(auVar62,_local_1508);
            auVar53 = vsubps_avx(auVar77,_local_1518);
            auVar54 = vsubps_avx(auVar94,auVar44);
            fVar152 = local_1518._0_4_;
            fVar92 = auVar77._0_4_ + fVar152;
            fVar87 = local_1518._4_4_;
            fVar99 = auVar77._4_4_ + fVar87;
            fVar9 = local_1518._8_4_;
            fVar100 = auVar77._8_4_ + fVar9;
            fVar12 = local_1518._12_4_;
            fVar101 = auVar77._12_4_ + fVar12;
            fVar154 = auVar44._0_4_;
            fVar102 = auVar94._0_4_ + fVar154;
            fVar89 = auVar44._4_4_;
            fVar109 = auVar94._4_4_ + fVar89;
            fVar10 = auVar44._8_4_;
            fVar111 = auVar94._8_4_ + fVar10;
            fVar13 = auVar44._12_4_;
            fVar113 = auVar94._12_4_ + fVar13;
            fVar75 = auVar54._0_4_;
            auVar136._0_4_ = fVar75 * fVar92;
            fVar50 = auVar54._4_4_;
            auVar136._4_4_ = fVar50 * fVar99;
            fVar51 = auVar54._8_4_;
            auVar136._8_4_ = fVar51 * fVar100;
            fVar52 = auVar54._12_4_;
            auVar136._12_4_ = fVar52 * fVar101;
            fVar166 = auVar53._0_4_;
            auVar146._0_4_ = fVar166 * fVar102;
            fVar168 = auVar53._4_4_;
            auVar146._4_4_ = fVar168 * fVar109;
            fVar169 = auVar53._8_4_;
            auVar146._8_4_ = fVar169 * fVar111;
            fVar170 = auVar53._12_4_;
            auVar146._12_4_ = fVar170 * fVar113;
            auVar53 = vsubps_avx(auVar146,auVar136);
            fVar76 = local_1508._0_4_;
            fVar133 = auVar62._0_4_ + fVar76;
            fVar91 = local_1508._4_4_;
            fVar139 = auVar62._4_4_ + fVar91;
            fVar11 = local_1508._8_4_;
            fVar141 = auVar62._8_4_ + fVar11;
            fVar14 = local_1508._12_4_;
            fVar143 = auVar62._12_4_ + fVar14;
            fVar157 = auVar45._0_4_;
            auVar105._0_4_ = fVar157 * fVar102;
            fVar160 = auVar45._4_4_;
            auVar105._4_4_ = fVar160 * fVar109;
            fVar162 = auVar45._8_4_;
            auVar105._8_4_ = fVar162 * fVar111;
            fVar164 = auVar45._12_4_;
            auVar105._12_4_ = fVar164 * fVar113;
            auVar147._0_4_ = fVar133 * fVar75;
            auVar147._4_4_ = fVar139 * fVar50;
            auVar147._8_4_ = fVar141 * fVar51;
            auVar147._12_4_ = fVar143 * fVar52;
            auVar45 = vsubps_avx(auVar147,auVar105);
            auVar137._0_4_ = fVar166 * fVar133;
            auVar137._4_4_ = fVar168 * fVar139;
            auVar137._8_4_ = fVar169 * fVar141;
            auVar137._12_4_ = fVar170 * fVar143;
            auVar96._0_4_ = fVar157 * fVar92;
            auVar96._4_4_ = fVar160 * fVar99;
            auVar96._8_4_ = fVar162 * fVar100;
            auVar96._12_4_ = fVar164 * fVar101;
            auVar54 = vsubps_avx(auVar96,auVar137);
            fVar92 = (ray->dir).field_0.m128[2];
            fVar99 = (ray->dir).field_0.m128[1];
            local_1568._4_4_ = fVar99;
            local_1568._0_4_ = fVar99;
            local_1568._8_4_ = fVar99;
            local_1568._12_4_ = fVar99;
            fStack_1574 = (ray->dir).field_0.m128[0];
            local_13c8._0_4_ =
                 fStack_1574 * auVar53._0_4_ + fVar99 * auVar45._0_4_ + fVar92 * auVar54._0_4_;
            local_13c8._4_4_ =
                 fStack_1574 * auVar53._4_4_ + fVar99 * auVar45._4_4_ + fVar92 * auVar54._4_4_;
            local_13c8._8_4_ =
                 fStack_1574 * auVar53._8_4_ + fVar99 * auVar45._8_4_ + fVar92 * auVar54._8_4_;
            local_13c8._12_4_ =
                 fStack_1574 * auVar53._12_4_ + fVar99 * auVar45._12_4_ + fVar92 * auVar54._12_4_;
            auVar45 = vsubps_avx(_local_1518,auVar119);
            auVar44 = vsubps_avx(auVar44,auVar120);
            fVar101 = fVar152 + auVar119._0_4_;
            fVar109 = fVar87 + auVar119._4_4_;
            fVar113 = fVar9 + auVar119._8_4_;
            fVar139 = fVar12 + auVar119._12_4_;
            fVar143 = auVar120._0_4_ + fVar154;
            fVar110 = auVar120._4_4_ + fVar89;
            fVar112 = auVar120._8_4_ + fVar10;
            fVar114 = auVar120._12_4_ + fVar13;
            fVar158 = auVar44._0_4_;
            auVar122._0_4_ = fVar158 * fVar101;
            fVar161 = auVar44._4_4_;
            auVar122._4_4_ = fVar161 * fVar109;
            fVar163 = auVar44._8_4_;
            auVar122._8_4_ = fVar163 * fVar113;
            fVar165 = auVar44._12_4_;
            auVar122._12_4_ = fVar165 * fVar139;
            fVar100 = auVar45._0_4_;
            auVar78._0_4_ = fVar100 * fVar143;
            fVar102 = auVar45._4_4_;
            auVar78._4_4_ = fVar102 * fVar110;
            fVar111 = auVar45._8_4_;
            auVar78._8_4_ = fVar111 * fVar112;
            fVar133 = auVar45._12_4_;
            auVar78._12_4_ = fVar133 * fVar114;
            auVar44 = vsubps_avx(auVar78,auVar122);
            auVar45 = vsubps_avx(_local_1508,auVar93);
            fVar141 = auVar45._0_4_;
            auVar106._0_4_ = fVar141 * fVar143;
            fVar143 = auVar45._4_4_;
            auVar106._4_4_ = fVar143 * fVar110;
            fVar110 = auVar45._8_4_;
            auVar106._8_4_ = fVar110 * fVar112;
            fVar112 = auVar45._12_4_;
            auVar106._12_4_ = fVar112 * fVar114;
            fVar114 = fVar76 + auVar93._0_4_;
            fVar130 = fVar91 + auVar93._4_4_;
            fVar131 = fVar11 + auVar93._8_4_;
            fVar132 = fVar14 + auVar93._12_4_;
            auVar138._0_4_ = fVar158 * fVar114;
            auVar138._4_4_ = fVar161 * fVar130;
            auVar138._8_4_ = fVar163 * fVar131;
            auVar138._12_4_ = fVar165 * fVar132;
            auVar45 = vsubps_avx(auVar138,auVar106);
            auVar123._0_4_ = fVar100 * fVar114;
            auVar123._4_4_ = fVar102 * fVar130;
            auVar123._8_4_ = fVar111 * fVar131;
            auVar123._12_4_ = fVar133 * fVar132;
            auVar97._0_4_ = fVar141 * fVar101;
            auVar97._4_4_ = fVar143 * fVar109;
            auVar97._8_4_ = fVar110 * fVar113;
            auVar97._12_4_ = fVar112 * fVar139;
            auVar53 = vsubps_avx(auVar97,auVar123);
            local_13b8._0_4_ =
                 fStack_1574 * auVar44._0_4_ + fVar99 * auVar45._0_4_ + fVar92 * auVar53._0_4_;
            local_13b8._4_4_ =
                 fStack_1574 * auVar44._4_4_ + fVar99 * auVar45._4_4_ + fVar92 * auVar53._4_4_;
            local_13b8._8_4_ =
                 fStack_1574 * auVar44._8_4_ + fVar99 * auVar45._8_4_ + fVar92 * auVar53._8_4_;
            local_13b8._12_4_ =
                 fStack_1574 * auVar44._12_4_ + fVar99 * auVar45._12_4_ + fVar92 * auVar53._12_4_;
            auVar44 = vsubps_avx(auVar93,auVar62);
            fVar74 = auVar93._0_4_ + auVar62._0_4_;
            fVar86 = auVar93._4_4_ + auVar62._4_4_;
            fVar88 = auVar93._8_4_ + auVar62._8_4_;
            fVar90 = auVar93._12_4_ + auVar62._12_4_;
            auVar93 = vsubps_avx(auVar119,auVar77);
            fVar114 = auVar119._0_4_ + auVar77._0_4_;
            fVar130 = auVar119._4_4_ + auVar77._4_4_;
            fVar131 = auVar119._8_4_ + auVar77._8_4_;
            fVar132 = auVar119._12_4_ + auVar77._12_4_;
            auVar119 = vsubps_avx(auVar120,auVar94);
            fVar101 = auVar120._0_4_ + auVar94._0_4_;
            fVar109 = auVar120._4_4_ + auVar94._4_4_;
            fVar113 = auVar120._8_4_ + auVar94._8_4_;
            fVar139 = auVar120._12_4_ + auVar94._12_4_;
            fVar134 = auVar119._0_4_;
            auVar54._0_4_ = fVar134 * fVar114;
            fVar140 = auVar119._4_4_;
            auVar54._4_4_ = fVar140 * fVar130;
            fVar142 = auVar119._8_4_;
            auVar54._8_4_ = fVar142 * fVar131;
            fVar144 = auVar119._12_4_;
            auVar54._12_4_ = fVar144 * fVar132;
            fVar149 = auVar93._0_4_;
            auVar124._0_4_ = fVar149 * fVar101;
            fVar151 = auVar93._4_4_;
            auVar124._4_4_ = fVar151 * fVar109;
            fVar153 = auVar93._8_4_;
            auVar124._8_4_ = fVar153 * fVar113;
            fVar155 = auVar93._12_4_;
            auVar124._12_4_ = fVar155 * fVar139;
            auVar93 = vsubps_avx(auVar124,auVar54);
            fVar103 = auVar44._0_4_;
            auVar119._0_4_ = fVar103 * fVar101;
            fVar101 = auVar44._4_4_;
            auVar119._4_4_ = fVar101 * fVar109;
            fVar109 = auVar44._8_4_;
            auVar119._8_4_ = fVar109 * fVar113;
            fVar113 = auVar44._12_4_;
            auVar119._12_4_ = fVar113 * fVar139;
            auVar125._0_4_ = fVar134 * fVar74;
            auVar125._4_4_ = fVar140 * fVar86;
            auVar125._8_4_ = fVar142 * fVar88;
            auVar125._12_4_ = fVar144 * fVar90;
            auVar44 = vsubps_avx(auVar125,auVar119);
            auVar79._0_4_ = fVar149 * fVar74;
            auVar79._4_4_ = fVar151 * fVar86;
            auVar79._8_4_ = fVar153 * fVar88;
            auVar79._12_4_ = fVar155 * fVar90;
            auVar64._0_4_ = fVar103 * fVar114;
            auVar64._4_4_ = fVar101 * fVar130;
            auVar64._8_4_ = fVar109 * fVar131;
            auVar64._12_4_ = fVar113 * fVar132;
            auVar119 = vsubps_avx(auVar64,auVar79);
            local_1578 = fStack_1574;
            fStack_1570 = fStack_1574;
            fStack_156c = fStack_1574;
            auVar45._0_4_ =
                 fStack_1574 * auVar93._0_4_ + fVar99 * auVar44._0_4_ + fVar92 * auVar119._0_4_;
            auVar45._4_4_ =
                 fStack_1574 * auVar93._4_4_ + fVar99 * auVar44._4_4_ + fVar92 * auVar119._4_4_;
            auVar45._8_4_ =
                 fStack_1574 * auVar93._8_4_ + fVar99 * auVar44._8_4_ + fVar92 * auVar119._8_4_;
            auVar45._12_4_ =
                 fStack_1574 * auVar93._12_4_ + fVar99 * auVar44._12_4_ + fVar92 * auVar119._12_4_;
            local_13a8._0_4_ = auVar45._0_4_ + local_13c8._0_4_ + local_13b8._0_4_;
            local_13a8._4_4_ = auVar45._4_4_ + local_13c8._4_4_ + local_13b8._4_4_;
            local_13a8._8_4_ = auVar45._8_4_ + local_13c8._8_4_ + local_13b8._8_4_;
            local_13a8._12_4_ = auVar45._12_4_ + local_13c8._12_4_ + local_13b8._12_4_;
            auVar44 = vminps_avx(local_13c8,local_13b8);
            auVar93 = vminps_avx(auVar44,auVar45);
            auVar65._8_4_ = 0x7fffffff;
            auVar65._0_8_ = 0x7fffffff7fffffff;
            auVar65._12_4_ = 0x7fffffff;
            auVar44 = vandps_avx(local_13a8,auVar65);
            auVar66._0_4_ = auVar44._0_4_ * 1.1920929e-07;
            auVar66._4_4_ = auVar44._4_4_ * 1.1920929e-07;
            auVar66._8_4_ = auVar44._8_4_ * 1.1920929e-07;
            auVar66._12_4_ = auVar44._12_4_ * 1.1920929e-07;
            auVar73 = ZEXT1664(auVar66);
            uVar32 = CONCAT44(auVar66._4_4_,auVar66._0_4_);
            auVar80._0_8_ = uVar32 ^ 0x8000000080000000;
            auVar80._8_4_ = -auVar66._8_4_;
            auVar80._12_4_ = -auVar66._12_4_;
            auVar93 = vcmpps_avx(auVar93,auVar80,5);
            auVar61 = ZEXT1664(auVar93);
            auVar119 = vmaxps_avx(local_13c8,local_13b8);
            auVar119 = vmaxps_avx(auVar119,auVar45);
            auVar119 = vcmpps_avx(auVar119,auVar66,2);
            auVar93 = vorps_avx(auVar93,auVar119);
            mapUV = (UVIdentity<4>)0x0;
            local_1398 = &mapUV;
            auVar119 = auVar24 & auVar93;
            if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar119 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar119 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar119[0xf] < '\0') {
              auVar46._0_4_ = fVar75 * fVar100;
              auVar46._4_4_ = fVar50 * fVar102;
              auVar46._8_4_ = fVar51 * fVar111;
              auVar46._12_4_ = fVar52 * fVar133;
              auVar55._0_4_ = fVar166 * fVar158;
              auVar55._4_4_ = fVar168 * fVar161;
              auVar55._8_4_ = fVar169 * fVar163;
              auVar55._12_4_ = fVar170 * fVar165;
              auVar62 = vsubps_avx(auVar55,auVar46);
              auVar67._0_4_ = fVar149 * fVar158;
              auVar67._4_4_ = fVar151 * fVar161;
              auVar67._8_4_ = fVar153 * fVar163;
              auVar67._12_4_ = fVar155 * fVar165;
              auVar81._0_4_ = fVar100 * fVar134;
              auVar81._4_4_ = fVar102 * fVar140;
              auVar81._8_4_ = fVar111 * fVar142;
              auVar81._12_4_ = fVar133 * fVar144;
              auVar77 = vsubps_avx(auVar81,auVar67);
              auVar126._8_4_ = 0x7fffffff;
              auVar126._0_8_ = 0x7fffffff7fffffff;
              auVar126._12_4_ = 0x7fffffff;
              auVar119 = vandps_avx(auVar46,auVar126);
              auVar120 = vandps_avx(auVar67,auVar126);
              auVar119 = vcmpps_avx(auVar119,auVar120,1);
              local_1348 = vblendvps_avx(auVar77,auVar62,auVar119);
              auVar56._0_4_ = fVar141 * fVar134;
              auVar56._4_4_ = fVar143 * fVar140;
              auVar56._8_4_ = fVar110 * fVar142;
              auVar56._12_4_ = fVar112 * fVar144;
              auVar68._0_4_ = fVar75 * fVar141;
              auVar68._4_4_ = fVar50 * fVar143;
              auVar68._8_4_ = fVar51 * fVar110;
              auVar68._12_4_ = fVar52 * fVar112;
              auVar82._0_4_ = fVar157 * fVar158;
              auVar82._4_4_ = fVar160 * fVar161;
              auVar82._8_4_ = fVar162 * fVar163;
              auVar82._12_4_ = fVar164 * fVar165;
              auVar62 = vsubps_avx(auVar68,auVar82);
              auVar116._0_4_ = fVar158 * fVar103;
              auVar116._4_4_ = fVar161 * fVar101;
              auVar116._8_4_ = fVar163 * fVar109;
              auVar116._12_4_ = fVar165 * fVar113;
              auVar77 = vsubps_avx(auVar116,auVar56);
              auVar119 = vandps_avx(auVar82,auVar126);
              auVar120 = vandps_avx(auVar56,auVar126);
              auVar119 = vcmpps_avx(auVar119,auVar120,1);
              local_1338 = vblendvps_avx(auVar77,auVar62,auVar119);
              auVar61 = ZEXT1664(local_1338);
              auVar69._0_4_ = fVar100 * fVar103;
              auVar69._4_4_ = fVar102 * fVar101;
              auVar69._8_4_ = fVar111 * fVar109;
              auVar69._12_4_ = fVar133 * fVar113;
              auVar83._0_4_ = fVar157 * fVar100;
              auVar83._4_4_ = fVar160 * fVar102;
              auVar83._8_4_ = fVar162 * fVar111;
              auVar83._12_4_ = fVar164 * fVar133;
              auVar107._0_4_ = fVar166 * fVar141;
              auVar107._4_4_ = fVar168 * fVar143;
              auVar107._8_4_ = fVar169 * fVar110;
              auVar107._12_4_ = fVar170 * fVar112;
              auVar117._0_4_ = fVar141 * fVar149;
              auVar117._4_4_ = fVar143 * fVar151;
              auVar117._8_4_ = fVar110 * fVar153;
              auVar117._12_4_ = fVar112 * fVar155;
              auVar62 = vsubps_avx(auVar83,auVar107);
              auVar77 = vsubps_avx(auVar117,auVar69);
              auVar119 = vandps_avx(auVar107,auVar126);
              auVar120 = vandps_avx(auVar69,auVar126);
              auVar119 = vcmpps_avx(auVar119,auVar120,1);
              local_1328 = vblendvps_avx(auVar77,auVar62,auVar119);
              auVar73 = ZEXT1664(local_1328);
              fVar75 = local_1348._0_4_ * fStack_1574 +
                       local_1338._0_4_ * fVar99 + local_1328._0_4_ * fVar92;
              fVar100 = local_1348._4_4_ * fStack_1574 +
                        local_1338._4_4_ * fVar99 + local_1328._4_4_ * fVar92;
              fVar101 = local_1348._8_4_ * fStack_1574 +
                        local_1338._8_4_ * fVar99 + local_1328._8_4_ * fVar92;
              fVar92 = local_1348._12_4_ * fStack_1574 +
                       local_1338._12_4_ * fVar99 + local_1328._12_4_ * fVar92;
              auVar108._0_4_ = fVar75 + fVar75;
              auVar108._4_4_ = fVar100 + fVar100;
              auVar108._8_4_ = fVar101 + fVar101;
              auVar108._12_4_ = fVar92 + fVar92;
              fVar76 = local_1348._0_4_ * fVar76 +
                       local_1338._0_4_ * fVar152 + local_1328._0_4_ * fVar154;
              fVar87 = local_1348._4_4_ * fVar91 +
                       local_1338._4_4_ * fVar87 + local_1328._4_4_ * fVar89;
              fVar89 = local_1348._8_4_ * fVar11 +
                       local_1338._8_4_ * fVar9 + local_1328._8_4_ * fVar10;
              fVar91 = local_1348._12_4_ * fVar14 +
                       local_1338._12_4_ * fVar12 + local_1328._12_4_ * fVar13;
              auVar119 = vrcpps_avx(auVar108);
              fVar92 = auVar119._0_4_;
              auVar127._0_4_ = auVar108._0_4_ * fVar92;
              fVar99 = auVar119._4_4_;
              auVar127._4_4_ = auVar108._4_4_ * fVar99;
              fVar152 = auVar119._8_4_;
              auVar127._8_4_ = auVar108._8_4_ * fVar152;
              fVar154 = auVar119._12_4_;
              auVar127._12_4_ = auVar108._12_4_ * fVar154;
              auVar148._8_4_ = 0x3f800000;
              auVar148._0_8_ = &DAT_3f8000003f800000;
              auVar148._12_4_ = 0x3f800000;
              auVar119 = vsubps_avx(auVar148,auVar127);
              local_1358._0_4_ = (fVar76 + fVar76) * (fVar92 + fVar92 * auVar119._0_4_);
              local_1358._4_4_ = (fVar87 + fVar87) * (fVar99 + fVar99 * auVar119._4_4_);
              local_1358._8_4_ = (fVar89 + fVar89) * (fVar152 + fVar152 * auVar119._8_4_);
              local_1358._12_4_ = (fVar91 + fVar91) * (fVar154 + fVar154 * auVar119._12_4_);
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar118._4_4_ = uVar4;
              auVar118._0_4_ = uVar4;
              auVar118._8_4_ = uVar4;
              auVar118._12_4_ = uVar4;
              auVar119 = vcmpps_avx(auVar118,local_1358,2);
              fVar92 = ray->tfar;
              auVar128._4_4_ = fVar92;
              auVar128._0_4_ = fVar92;
              auVar128._8_4_ = fVar92;
              auVar128._12_4_ = fVar92;
              auVar120 = vcmpps_avx(local_1358,auVar128,2);
              auVar119 = vandps_avx(auVar119,auVar120);
              auVar120 = vcmpps_avx(auVar108,_DAT_01feba10,4);
              auVar119 = vandps_avx(auVar120,auVar119);
              auVar93 = vandps_avx(auVar93,auVar24);
              auVar119 = vpslld_avx(auVar119,0x1f);
              auVar120 = vpsrad_avx(auVar119,0x1f);
              auVar119 = auVar93 & auVar120;
              if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar119[0xf] < '\0') {
                local_1388 = vandps_avx(auVar120,auVar93);
                auVar93 = vrcpps_avx(local_13a8);
                fVar92 = auVar93._0_4_;
                auVar57._0_4_ = local_13a8._0_4_ * fVar92;
                fVar99 = auVar93._4_4_;
                auVar57._4_4_ = local_13a8._4_4_ * fVar99;
                fVar152 = auVar93._8_4_;
                auVar57._8_4_ = local_13a8._8_4_ * fVar152;
                fVar154 = auVar93._12_4_;
                auVar57._12_4_ = local_13a8._12_4_ * fVar154;
                auVar70._8_4_ = 0x3f800000;
                auVar70._0_8_ = &DAT_3f8000003f800000;
                auVar70._12_4_ = 0x3f800000;
                auVar73 = ZEXT1664(auVar70);
                auVar93 = vsubps_avx(auVar70,auVar57);
                auVar47._0_4_ = fVar92 + fVar92 * auVar93._0_4_;
                auVar47._4_4_ = fVar99 + fVar99 * auVar93._4_4_;
                auVar47._8_4_ = fVar152 + fVar152 * auVar93._8_4_;
                auVar47._12_4_ = fVar154 + fVar154 * auVar93._12_4_;
                auVar58._8_4_ = 0x219392ef;
                auVar58._0_8_ = 0x219392ef219392ef;
                auVar58._12_4_ = 0x219392ef;
                auVar44 = vcmpps_avx(auVar44,auVar58,5);
                auVar44 = vandps_avx(auVar44,auVar47);
                auVar59._0_4_ = local_13c8._0_4_ * auVar44._0_4_;
                auVar59._4_4_ = local_13c8._4_4_ * auVar44._4_4_;
                auVar59._8_4_ = local_13c8._8_4_ * auVar44._8_4_;
                auVar59._12_4_ = local_13c8._12_4_ * auVar44._12_4_;
                local_1378 = vminps_avx(auVar59,auVar70);
                auVar61 = ZEXT1664(local_1378);
                auVar48._0_4_ = local_13b8._0_4_ * auVar44._0_4_;
                auVar48._4_4_ = local_13b8._4_4_ * auVar44._4_4_;
                auVar48._8_4_ = local_13b8._8_4_ * auVar44._8_4_;
                auVar48._12_4_ = local_13b8._12_4_ * auVar44._12_4_;
                local_1368 = vminps_avx(auVar48,auVar70);
                uVar37 = vmovmskps_avx(local_1388);
                uVar32 = (ulong)uVar37;
                do {
                  uVar33 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  h.geomID = *(uint *)((long)&local_13d8 + uVar33 * 4);
                  pGVar7 = (pSVar6->geometries).items[h.geomID].ptr;
                  if ((pGVar7->mask & ray->mask) == 0) {
                    uVar32 = uVar32 ^ 1L << (uVar33 & 0x3f);
                    bVar23 = true;
                  }
                  else {
                    pRVar8 = context->args;
                    if ((pRVar8->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar23 = false;
                    }
                    else {
                      h.u = *(float *)(local_1378 + uVar33 * 4);
                      h.v = *(float *)(local_1368 + uVar33 * 4);
                      auVar61 = ZEXT464((uint)h.v);
                      args.context = context->user;
                      h.primID = *(uint *)((long)&local_13e8 + uVar33 * 4);
                      h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1348 + uVar33 * 4);
                      auVar73 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                      h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_1338 + uVar33 * 4);
                      h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_1328 + uVar33 * 4);
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      fVar92 = ray->tfar;
                      ray->tfar = *(float *)(local_1358 + uVar33 * 4);
                      local_157c = -1;
                      args.valid = &local_157c;
                      args.geometryUserPtr = pGVar7->userPtr;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0030a08b:
                        if (pRVar8->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            auVar73 = ZEXT1664(auVar73._0_16_);
                            (*pRVar8->filter)(&args);
                            auVar61._8_56_ = extraout_var_00;
                            auVar61._0_8_ = extraout_XMM1_Qa_00;
                          }
                          if (*args.valid == 0) goto LAB_0030a0d7;
                        }
                        bVar23 = false;
                      }
                      else {
                        auVar73 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                        (*pGVar7->occlusionFilterN)(&args);
                        auVar61._8_56_ = extraout_var;
                        auVar61._0_8_ = extraout_XMM1_Qa;
                        if (*args.valid != 0) goto LAB_0030a08b;
LAB_0030a0d7:
                        ray->tfar = fVar92;
                        uVar32 = uVar32 ^ 1L << (uVar33 & 0x3f);
                        bVar23 = true;
                      }
                    }
                  }
                  iVar29 = 0;
                  if (!bVar23) {
                    uVar36 = local_1528;
                    uVar32 = local_1530;
                    uVar33 = local_1538;
                    uVar38 = local_1550;
                    uVar39 = local_1540;
                    uVar41 = local_1548;
                    if (bVar43) {
                      ray->tfar = -INFINITY;
                      iVar29 = 3;
                    }
                    goto LAB_0030a197;
                  }
                } while (uVar32 != 0);
              }
            }
            local_14f0 = local_14f0 + 1;
            bVar43 = local_14f0 < local_14f8;
          } while (local_14f0 != local_14f8);
          iVar29 = 0;
          uVar36 = local_1528;
          uVar32 = local_1530;
          uVar33 = local_1538;
          uVar38 = local_1550;
          uVar39 = local_1540;
          uVar41 = local_1548;
        }
      }
LAB_0030a197:
    } while (iVar29 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }